

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  _Alloc_hider _Var2;
  int iVar3;
  error_category *peVar4;
  bool bVar5;
  file_status fVar6;
  bool bVar7;
  error_code tec;
  path current;
  file_status fs;
  string_type part;
  iterator __begin2;
  iterator __end2;
  path local_140;
  undefined1 *local_120;
  error_category *local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  path local_100;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  iterator local_b0;
  iterator local_70;
  
  local_120 = &local_110;
  local_118 = (error_category *)0x0;
  local_110 = 0;
  peVar4 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar4;
  local_140._path._M_dataplus._M_p = (p->_path)._M_dataplus._M_p;
  local_d0._M_allocated_capacity =
       (p->_path)._M_string_length + (long)local_140._path._M_dataplus._M_p;
  local_70._first._M_current = local_140._path._M_dataplus._M_p;
  path::iterator::iterator
            (&local_b0,&local_70._first,(const_iterator *)&local_d0._M_allocated_capacity,
             (const_iterator *)&local_140);
  local_d0._M_allocated_capacity = (size_type)(p->_path)._M_dataplus._M_p;
  local_140._path._M_dataplus._M_p =
       (pointer)(local_d0._M_allocated_capacity + (p->_path)._M_string_length);
  local_100._path._M_dataplus._M_p = local_140._path._M_dataplus._M_p;
  path::iterator::iterator
            (&local_70,(const_iterator *)&local_d0._M_allocated_capacity,
             (const_iterator *)&local_140,(const_iterator *)&local_100);
  bVar5 = false;
  do {
    if (local_b0._iter._M_current == local_70._iter._M_current) {
LAB_00157d27:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
        operator_delete(local_70._current._path._M_dataplus._M_p,
                        local_70._current._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._current._path._M_dataplus._M_p != &local_b0._current._path.field_2) {
        operator_delete(local_b0._current._path._M_dataplus._M_p,
                        local_b0._current._path.field_2._M_allocated_capacity + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
      }
      return bVar5;
    }
    local_d0._M_allocated_capacity = (size_type)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0._current._path._M_dataplus._M_p,
               local_b0._current._path._M_dataplus._M_p + local_b0._current._path._M_string_length);
    path::append<std::__cxx11::string>
              ((path *)&local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
    path::root_name(&local_140,p);
    fVar6 = (file_status)local_140._path._M_dataplus._M_p;
    if ((local_118 == (error_category *)local_140._path._M_string_length) &&
       ((local_118 == (error_category *)0x0 ||
        (iVar3 = bcmp(local_120,local_140._path._M_dataplus._M_p,(size_t)local_118), iVar3 == 0))))
    {
      bVar7 = false;
    }
    else {
      path::root_path(&local_100,p);
      _Var2._M_p = local_100._path._M_dataplus._M_p;
      if (local_118 == (error_category *)local_100._path._M_string_length) {
        if (local_118 == (error_category *)0x0) {
          bVar7 = false;
        }
        else {
          iVar3 = bcmp(local_120,local_100._path._M_dataplus._M_p,(size_t)local_118);
          bVar7 = iVar3 != 0;
        }
      }
      else {
        bVar7 = true;
      }
      fVar6 = (file_status)local_140._path._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_100._path.field_2) {
        operator_delete(_Var2._M_p,local_100._path.field_2._M_allocated_capacity + 1);
        fVar6 = (file_status)local_140._path._M_dataplus._M_p;
      }
    }
    if (fVar6 != (file_status)&local_140._path.field_2) {
      operator_delete((void *)fVar6,local_140._path.field_2._M_allocated_capacity + 1);
    }
    bVar1 = true;
    if (bVar7) {
      local_140._path._M_dataplus._M_p = local_140._path._M_dataplus._M_p & 0xffffffff00000000;
      local_140._path._M_string_length = (size_type)peVar4;
      detail::status_ex((path *)local_e0,(error_code *)&local_120,(file_status *)&local_140,
                        (uintmax_t *)0x0,(uintmax_t *)0x0,(time_t *)0x0,0);
      if ((file_type)local_140._path._M_dataplus._M_p == none) {
        if ((uint)local_e0._0_4_ < 2) goto LAB_00157c83;
        bVar1 = true;
        if (local_e0._0_4_ != 3) {
          ec->_M_value = 0x11;
          ec->_M_cat = peVar4;
          goto LAB_00157ce7;
        }
      }
      else if (local_e0._0_4_ == 1) {
LAB_00157c83:
        create_directory((path *)&local_120,ec);
        bVar1 = true;
        if (ec->_M_value != 0) {
          detail::status_ex((path *)(local_e0 + 8),(error_code *)&local_120,
                            (file_status *)&local_100,(uintmax_t *)0x0,(uintmax_t *)0x0,
                            (time_t *)0x0,0);
          if (local_e0._8_4_ != 3) goto LAB_00157ce7;
          ec->_M_value = 0;
          ec->_M_cat = peVar4;
        }
        bVar5 = true;
      }
      else {
        *(pointer *)ec = local_140._path._M_dataplus._M_p;
        ec->_M_cat = (error_category *)local_140._path._M_string_length;
LAB_00157ce7:
        bVar1 = false;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_allocated_capacity != &local_c0) {
      operator_delete((void *)local_d0._M_allocated_capacity,local_c0._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      bVar5 = false;
      goto LAB_00157d27;
    }
    path::iterator::operator++(&local_b0);
  } while( true );
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    for (path::string_type part : p) {
        current /= part;
        if (current != p.root_name() && current != p.root_path()) {
            std::error_code tec;
            auto fs = status(current, tec);
            if (tec && fs.type() != file_type::not_found) {
                ec = tec;
                return false;
            }
            if (!exists(fs)) {
                create_directory(current, ec);
                if (ec) {
                    std::error_code tmp_ec;
                    if (is_directory(current, tmp_ec)) {
                        ec.clear();
                    } else {
                        return false;
                    }
                }
                didCreate = true;
            }
#ifndef LWG_2935_BEHAVIOUR
            else if (!is_directory(fs)) {
                ec = detail::make_error_code(detail::portable_error::exists);
                return false;
            }
#endif
        }
    }
    return didCreate;
}